

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utilities.c
# Opt level: O2

size_t StringUtilities_code_point_length_for_part(wchar_t *string,wchar_t length)

{
  _Bool _Var1;
  wchar_t wVar2;
  size_t sVar3;
  
  sVar3 = 0;
  for (wVar2 = L'\0'; wVar2 < length; wVar2 = wVar2 + (uint)_Var1 + L'\x01') {
    _Var1 = UnicodeUtilities_is_utf16_surrogate(string[wVar2]);
    sVar3 = sVar3 + 1;
  }
  return sVar3;
}

Assistant:

size_t StringUtilities_code_point_length_for_part(const wchar_t* string, const int length) {
    int code_points = 0;
    int i;
    for (i = 0; i < length; ++i) {
        ++code_points;
        if (UnicodeUtilities_is_utf16_surrogate(string[i])) {
            ++i;
        }

    }
    return code_points;
}